

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRequiresForLibrary
          (Generator *this,GeneratorOptions *options,Printer *printer,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *provided)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  pointer ppFVar4;
  undefined7 extraout_var;
  FileDescriptor *pFVar5;
  int j;
  long lVar6;
  string *__lhs;
  long lVar7;
  ulong uVar8;
  bool have_message;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_e8;
  ulong local_e0;
  GeneratorOptions *local_d8;
  Printer *local_d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  Generator *local_c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forwards;
  string local_50;
  
  local_e8 = files;
  local_d8 = options;
  local_d0 = printer;
  local_c8 = provided;
  local_c0 = this;
  if (options->import_style != kImportClosure) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&required,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x710);
    options = (GeneratorOptions *)
              internal::LogMessage::operator<<
                        ((LogMessage *)&required,
                         "CHECK failed: (options.import_style) == (GeneratorOptions::kImportClosure): "
                        );
    internal::LogFinisher::operator=((LogFinisher *)&forwards,(LogMessage *)options);
    internal::LogMessage::~LogMessage((LogMessage *)&required);
  }
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &required._M_t._M_impl.super__Rb_tree_header._M_header;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  required._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &forwards._M_t._M_impl.super__Rb_tree_header._M_header;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  forwards._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  have_message = false;
  ppFVar4 = (local_e8->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  bVar3 = false;
  local_e0 = 0;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       required._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_002866dc:
  if ((ulong)((long)(local_e8->
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3) <= uVar8) {
    GenerateRequiresImpl
              ((Generator *)(ulong)bVar3,(GeneratorOptions *)(ulong)((byte)local_e0 & 1),local_d0,
               &required,&forwards,local_c8,have_message,bVar3,SUB41((byte)local_e0 & 1,0));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&forwards._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&required._M_t);
    return;
  }
  lVar7 = 0;
  for (lVar6 = 0; pFVar5 = ppFVar4[uVar8], lVar6 < *(int *)(pFVar5 + 0x2c); lVar6 = lVar6 + 1) {
    if (*(char *)(*(long *)(*(long *)(pFVar5 + 0x68) + 0x20 + lVar7) + 0x4b) == '\0') {
      options = local_d8;
      FindRequiresForMessage
                (local_c0,local_d8,(Descriptor *)(*(long *)(pFVar5 + 0x68) + lVar7),&required,
                 &forwards,&have_message);
      ppFVar4 = (local_e8->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    lVar7 = lVar7 + 0x90;
  }
  if (!bVar3) {
    lVar6 = -1;
    lVar7 = 0;
    do {
      lVar6 = lVar6 + 1;
      if (*(int *)(pFVar5 + 0x38) <= lVar6) {
        lVar6 = -1;
        lVar7 = 0;
        goto LAB_00286785;
      }
      bVar2 = anon_unknown_0::ShouldGenerateExtension
                        ((FieldDescriptor *)(lVar7 + *(long *)(pFVar5 + 0x80)));
      lVar7 = lVar7 + 0x98;
    } while (!bVar2);
    goto LAB_002867a8;
  }
  goto LAB_002867ab;
  while( true ) {
    bVar2 = anon_unknown_0::HasExtensions((Descriptor *)(lVar7 + *(long *)(pFVar5 + 0x68)));
    lVar7 = lVar7 + 0x90;
    if (bVar2) break;
LAB_00286785:
    lVar6 = lVar6 + 1;
    if (*(int *)(pFVar5 + 0x2c) <= lVar6) goto LAB_002867ab;
  }
LAB_002867a8:
  bVar3 = true;
LAB_002867ab:
  if ((local_e0 & 1) == 0) {
    pFVar5 = (local_e8->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar8];
    lVar6 = -1;
    lVar7 = 0;
    do {
      lVar6 = lVar6 + 1;
      if (*(int *)(pFVar5 + 0x2c) <= lVar6) goto LAB_002867ee;
      bVar2 = anon_unknown_0::HasMap
                        ((GeneratorOptions *)(*(long *)(pFVar5 + 0x68) + lVar7),
                         (Descriptor *)options);
      lVar7 = lVar7 + 0x90;
    } while (!bVar2);
    local_e0 = CONCAT71(extraout_var,1);
  }
LAB_002867ee:
  lVar6 = 0;
  lVar7 = 0;
  while( true ) {
    ppFVar4 = (local_e8->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pFVar5 = ppFVar4[uVar8];
    if (*(int *)(pFVar5 + 0x38) <= lVar7) break;
    lVar1 = *(long *)(pFVar5 + 0x80);
    bVar2 = anon_unknown_0::IgnoreField((FieldDescriptor *)(lVar1 + lVar6));
    if (!bVar2) {
      __lhs = *(string **)(*(long *)(lVar1 + 0x50 + lVar6) + 8);
      bVar3 = std::operator!=(__lhs,"google.protobuf.bridge.MessageSet");
      if (bVar3) {
        __lhs = &local_50;
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (__lhs,(_anonymous_namespace_ *)local_d8,
                   *(GeneratorOptions **)(lVar1 + 0x50 + lVar6),(Descriptor *)pFVar5);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&required,__lhs);
        std::__cxx11::string::~string((string *)__lhs);
      }
      bVar3 = true;
      options = local_d8;
      FindRequiresForField
                ((Generator *)__lhs,local_d8,(FieldDescriptor *)(lVar1 + lVar6),&required,&forwards)
      ;
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x98;
  }
  uVar8 = uVar8 + 1;
  goto LAB_002866dc;
}

Assistant:

void Generator::GenerateRequiresForLibrary(
    const GeneratorOptions& options, io::Printer* printer,
    const std::vector<const FileDescriptor*>& files,
    std::set<std::string>* provided) const {
  GOOGLE_CHECK_EQ(options.import_style, GeneratorOptions::kImportClosure);
  // For Closure imports we need to import every message type individually.
  std::set<std::string> required;
  std::set<std::string> forwards;
  bool have_extensions = false;
  bool have_map = false;
  bool have_message = false;

  for (int i = 0; i < files.size(); i++) {
    for (int j = 0; j < files[i]->message_type_count(); j++) {
      const Descriptor* desc = files[i]->message_type(j);
      if (!IgnoreMessage(desc)) {
        FindRequiresForMessage(options, desc, &required, &forwards,
                               &have_message);
      }
    }

    if (!have_extensions && HasExtensions(files[i])) {
      have_extensions = true;
    }

    if (!have_map && FileHasMap(options, files[i])) {
      have_map = true;
    }

    for (int j = 0; j < files[i]->extension_count(); j++) {
      const FieldDescriptor* extension = files[i]->extension(j);
      if (IgnoreField(extension)) {
        continue;
      }
      if (extension->containing_type()->full_name() !=
          "google.protobuf.bridge.MessageSet") {
        required.insert(GetMessagePath(options, extension->containing_type()));
      }
      FindRequiresForField(options, extension, &required, &forwards);
      have_extensions = true;
    }
  }

  GenerateRequiresImpl(options, printer, &required, &forwards, provided,
                       /* require_jspb = */ have_message,
                       /* require_extension = */ have_extensions,
                       /* require_map = */ have_map);
}